

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIListBox::setItem(CGUIListBox *this,u32 index,wchar_t *text,s32 icon)

{
  pointer pLVar1;
  
  pLVar1 = (this->Items).m_data.
           super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (index < (uint)((int)((ulong)((long)(this->Items).m_data.
                                         super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1)
                          >> 3) * 0x38e38e39)) {
    core::string<wchar_t>::operator=(&pLVar1[index].Text,text);
    (this->Items).m_data.
    super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
    ._M_impl.super__Vector_impl_data._M_start[index].Icon = icon;
    recalculateItemHeight(this);
    recalculateItemWidth(this,icon);
    return;
  }
  return;
}

Assistant:

void CGUIListBox::setItem(u32 index, const wchar_t *text, s32 icon)
{
	if (index >= Items.size())
		return;

	Items[index].Text = text;
	Items[index].Icon = icon;

	recalculateItemHeight();
	recalculateItemWidth(icon);
}